

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void checkPropertyConsistency<char_const*>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,char **param_7)

{
  cmLocalGenerator *this;
  string_view str;
  bool bVar1;
  cmValue cVar2;
  string *a;
  ostream *poVar3;
  string *psVar4;
  pointer __v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  undefined4 in_stack_fffffffffffffd98;
  cmList props;
  string local_228;
  string pdir;
  string pfile;
  string pname;
  ostringstream e;
  
  psVar4 = config;
  cVar2 = cmGeneratorTarget::GetProperty(dependee,propName);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&e,(string *)cVar2.Value);
    init._M_len = 1;
    init._M_array = (iterator)&e;
    cmList::cmList(&props,init);
    std::__cxx11::string::~string((string *)&e);
    a = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmStrCat<std::__cxx11::string_const&,char_const(&)[16]>
              (&pdir,a,(char (*) [16])"/Help/prop_tgt/");
    for (__v = props.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __v != props.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __v = __v + 1) {
      str._M_len._4_4_ = t;
      str._M_len._0_4_ = in_stack_fffffffffffffd98;
      str._M_str = (char *)propName;
      cmSystemTools::HelpFileName_abi_cxx11_(str);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&pdir,
                     &pname);
      std::operator+(&pfile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     ".rst");
      std::__cxx11::string::~string((string *)&e);
      bVar1 = cmsys::SystemTools::FileExists(&pfile,true);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,"Target \"");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        poVar3 = std::operator<<(poVar3,"\" has property \"");
        poVar3 = std::operator<<(poVar3,(string *)__v);
        poVar3 = std::operator<<(poVar3,"\" listed in its ");
        poVar3 = std::operator<<(poVar3,(string *)propName);
        poVar3 = std::operator<<(poVar3,
                                 " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                                );
        poVar3 = std::operator<<(poVar3,(string *)propName);
        std::operator<<(poVar3," property.");
        this = depender->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_0038b673:
        std::__cxx11::string::~string((string *)&pfile);
        std::__cxx11::string::~string((string *)&pname);
        break;
      }
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)emitted,__v);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        getLinkInterfaceDependentProperty<char_const*>(depender,__v,config,t,(char **)psVar4);
        bVar1 = cmSystemTools::GetErrorOccurredFlag();
        if (bVar1) goto LAB_0038b673;
      }
      std::__cxx11::string::~string((string *)&pfile);
      std::__cxx11::string::~string((string *)&pname);
    }
    std::__cxx11::string::~string((string *)&pdir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props.Values);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  cmValue prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  cmList props{ *prop };
  std::string pdir =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Help/prop_tgt/");

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccurredFlag()) {
        return;
      }
    }
  }
}